

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution3d.cpp
# Opt level: O0

int ncnn::deconvolution3d
              (Mat *bottom_blob,Mat *top_blob,Mat *weight_data,Mat *bias_data,int kernel_w,
              int kernel_h,int kernel_d,int stride_w,int stride_h,int stride_d,int dilation_w,
              int dilation_h,int dilation_d,int activation_type,Mat *activation_params,Option *opt)

{
  int iVar1;
  float *pfVar2;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined4 *puVar3;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar4;
  float fVar5;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  long *in_stack_00000048;
  int i_3;
  int size_1;
  float *outptr_1;
  float w_1;
  int k;
  float val;
  int q;
  float *kptr;
  float *outptr;
  int j_1;
  int i_2;
  int z_1;
  int outd;
  int outh_1;
  int outw_1;
  int inch;
  int d;
  int h;
  int w;
  float bias;
  Mat out;
  int p;
  int j;
  int i;
  int z;
  int gap1;
  int gap0;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  Mat *m;
  int i_1;
  float *ptr;
  int size;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  float local_674;
  allocator_type *in_stack_fffffffffffff990;
  size_type in_stack_fffffffffffff998;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff9a0;
  undefined4 local_5e0;
  int local_5a0;
  int local_58c;
  undefined8 local_588;
  undefined8 local_580;
  undefined8 local_578;
  undefined4 local_570;
  long local_568;
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined8 local_548;
  undefined8 local_540;
  undefined8 local_538;
  undefined8 local_530;
  undefined4 local_528;
  long local_520;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined8 local_500;
  float local_4f8;
  int local_4f4;
  long local_4f0;
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined4 local_4d0;
  long *local_4c8;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  undefined4 local_4b4;
  undefined4 local_4b0;
  undefined8 local_4a8;
  long local_4a0;
  int local_494;
  int local_490;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  int local_47c;
  int local_478;
  int local_474;
  int local_470;
  undefined4 local_46c;
  undefined4 *local_468;
  int *local_460;
  ulong local_458;
  undefined4 local_450;
  long *local_448;
  int local_440;
  int local_43c;
  int local_438;
  undefined4 local_434;
  int local_430;
  ulong local_428;
  int local_420;
  int local_41c;
  int local_418;
  int local_414;
  int local_410;
  int local_40c;
  int local_408;
  int local_404;
  reference local_400;
  vector<int,_std::allocator<int>_> local_3e0;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  long *local_3b0;
  long *local_3a8;
  long *local_3a0;
  long *local_398;
  undefined8 *local_390;
  undefined8 *local_380;
  undefined8 *local_370;
  undefined4 **local_360;
  long *local_350;
  int local_338;
  undefined4 local_334;
  undefined4 **local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined4 *local_298;
  long *local_288;
  undefined1 local_27d;
  int local_27c;
  undefined4 **local_270;
  long local_248;
  long *local_240;
  int local_234;
  undefined4 *local_230;
  int local_228;
  undefined4 local_224;
  undefined4 **local_220;
  undefined4 **local_218;
  int local_20c;
  undefined4 **local_208;
  undefined8 *local_200;
  int local_1f4;
  undefined8 *local_1f0;
  long *local_1e8;
  undefined1 local_1dd;
  int local_1dc;
  undefined8 *local_1d0;
  int local_1a4;
  undefined8 *local_1a0;
  undefined8 *local_198;
  int local_18c;
  undefined8 *local_188;
  undefined4 **local_180;
  float local_174;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  long *local_150;
  float local_144 [3];
  long *local_138;
  undefined8 local_130;
  long *local_128;
  undefined8 local_120;
  long *local_118;
  undefined8 local_110;
  long *local_108;
  undefined8 local_100;
  long *local_f8;
  long local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  undefined4 local_cc;
  int local_c8;
  int local_c4;
  undefined8 *local_c0;
  long *local_b8;
  undefined4 local_ac;
  ulong local_a8;
  undefined4 *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  undefined4 **local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  long local_60;
  undefined4 local_54;
  long local_50;
  long local_48;
  int local_40;
  int local_3c;
  undefined8 *local_38;
  long *local_30;
  undefined4 local_24;
  ulong local_20;
  undefined4 *local_18;
  int local_10;
  int local_c;
  undefined8 *local_8;
  
  local_3bc = *(int *)((long)in_RSI + 0x2c);
  local_3c0 = (int)in_RSI[6];
  local_3c4 = (int)in_RSI[7];
  local_3c8 = in_R8D * in_R9D * in_stack_00000008;
  local_3b8 = in_R9D;
  local_3b4 = in_R8D;
  local_3b0 = in_RCX;
  local_3a8 = in_RDX;
  local_3a0 = in_RSI;
  local_398 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x1d9af8c);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998,in_stack_fffffffffffff990);
  std::allocator<int>::~allocator((allocator<int> *)0x1d9afb8);
  local_400 = std::vector<int,_std::allocator<int>_>::operator[](&local_3e0,0);
  local_404 = 0;
  local_408 = 0;
  local_40c = local_3bc * in_stack_00000030 - local_3b4 * in_stack_00000028;
  local_410 = local_3c0 * local_3bc * in_stack_00000038 - local_3bc * local_3b8 * in_stack_00000030;
  for (local_414 = 0; local_414 < in_stack_00000008; local_414 = local_414 + 1) {
    for (local_418 = 0; local_418 < local_3b8; local_418 = local_418 + 1) {
      for (local_41c = 0; local_41c < local_3b4; local_41c = local_41c + 1) {
        local_400[local_404] = local_408;
        local_404 = local_404 + 1;
        local_408 = in_stack_00000028 + local_408;
      }
      local_408 = local_40c + local_408;
    }
    local_408 = local_410 + local_408;
  }
  for (local_420 = 0; local_420 < local_3c4; local_420 = local_420 + 1) {
    local_270 = &local_468;
    local_8c = *(int *)((long)local_3a0 + 0x2c);
    local_90 = (int)local_3a0[6];
    local_94 = *(int *)((long)local_3a0 + 0x34);
    puVar3 = (undefined4 *)(*local_3a0 + local_3a0[8] * (long)local_420 * local_3a0[2]);
    local_a8 = local_3a0[2];
    local_ac = (undefined4)local_3a0[3];
    local_b8 = (long *)local_3a0[4];
    local_88 = &local_468;
    local_460 = (int *)0x0;
    local_434 = 1;
    local_78 = (long)local_8c * (long)local_90 * local_a8;
    local_428 = (local_78 + 0xfU & 0xfffffffffffffff0) / local_a8;
    local_440 = (int)local_3a0[5] + -1;
    if ((int)local_3a0[5] == 4) {
      local_428 = (long)*(int *)((long)local_3a0 + 0x2c) * (long)(int)local_3a0[6];
    }
    local_7c = 0x10;
    local_27c = local_420;
    local_27d = 1;
    local_350 = local_3b0;
    bVar4 = true;
    if (*local_3b0 != 0) {
      local_288 = local_3b0;
      bVar4 = local_3b0[8] * (long)(int)local_3b0[7] == 0;
    }
    if (bVar4) {
      local_5e0 = 0;
    }
    else {
      local_248 = (long)local_420;
      local_240 = local_3b0;
      local_5e0 = *(undefined4 *)(*local_3b0 + local_248 * 4);
    }
    local_46c = local_5e0;
    local_220 = &local_468;
    local_224 = local_5e0;
    local_228 = (int)local_428 * local_94;
    local_230 = puVar3;
    for (local_234 = 0; local_234 < local_228; local_234 = local_234 + 1) {
      *local_230 = local_5e0;
      local_230 = local_230 + 1;
    }
    local_470 = *(int *)((long)local_398 + 0x2c);
    local_474 = (int)local_398[6];
    local_478 = *(int *)((long)local_398 + 0x34);
    local_47c = (int)local_398[7];
    local_480 = *(int *)((long)local_3a0 + 0x2c);
    local_484 = (int)local_3a0[6];
    local_488 = *(int *)((long)local_3a0 + 0x34);
    for (local_48c = 0; local_48c < local_478; local_48c = local_48c + 1) {
      for (local_490 = 0; local_490 < local_474; local_490 = local_490 + 1) {
        for (local_494 = 0; local_494 < local_470; local_494 = local_494 + 1) {
          local_20c = local_48c * in_stack_00000020;
          local_200 = &local_4e8;
          local_208 = &local_468;
          local_18 = (undefined4 *)
                     ((long)puVar3 + (long)local_8c * (long)local_90 * (long)local_20c * local_a8);
          local_8 = &local_4e8;
          local_1f4 = local_490 * in_stack_00000018;
          local_1f0 = &local_4e8;
          local_4a0 = (long)local_18 +
                      (long)(local_494 * in_stack_00000010) * 4 +
                      (long)local_8c * (long)local_1f4 * local_a8;
          local_390 = &local_4e8;
          local_4e8 = 0;
          local_4d8 = 0;
          local_4d0 = 0;
          local_4c0 = 0;
          local_4bc = 0;
          local_4b8 = 0;
          local_4b4 = 0;
          local_4b0 = 0;
          local_4a8 = 0;
          local_4e0 = 0;
          local_1e8 = local_3a8;
          local_4f0 = *local_3a8 + (long)(local_3c8 * local_47c * local_420) * 4;
          for (local_4f4 = 0; local_4f4 < local_47c; local_4f4 = local_4f4 + 1) {
            local_1d0 = &local_588;
            local_c4 = *(int *)((long)local_398 + 0x2c);
            local_c8 = (int)local_398[6];
            local_cc = *(undefined4 *)((long)local_398 + 0x34);
            local_d8 = *local_398 + local_398[8] * (long)local_4f4 * local_398[2];
            local_e0 = local_398[2];
            local_e4 = (undefined4)local_398[3];
            local_f0 = local_398[4];
            local_c0 = &local_588;
            local_68 = (long)local_c4 * (long)local_c8 * local_e0;
            local_198 = &local_540;
            local_1a0 = &local_588;
            local_48 = local_d8 + (long)local_c4 * (long)local_c8 * (long)local_48c * local_e0;
            local_38 = &local_540;
            local_188 = &local_540;
            local_4f8 = *(float *)(local_48 + (long)local_c4 * (long)local_490 * local_e0 +
                                  (long)local_494 * 4);
            local_380 = &local_540;
            local_370 = &local_588;
            local_500 = 0;
            local_508 = 0;
            local_50c = 0;
            local_510 = 0;
            local_514 = 0;
            local_518 = 0;
            local_528 = 0;
            local_530 = 0;
            local_538 = 0;
            local_540 = 0;
            local_6c = 0x10;
            local_18c = local_490;
            local_1a4 = local_48c;
            local_1dc = local_4f4;
            local_1dd = 1;
            local_588 = 0;
            local_578 = 0;
            local_570 = 0;
            local_560 = 0;
            local_55c = 0;
            local_558 = 0;
            local_554 = 0;
            local_550 = 0;
            local_548 = 0;
            local_580 = 0;
            for (local_58c = 0; local_58c < local_3c8; local_58c = local_58c + 1) {
              *(float *)(local_4a0 + (long)local_400[local_58c] * 4) =
                   local_4f8 * *(float *)(local_4f0 + (long)local_58c * 4) +
                   *(float *)(local_4a0 + (long)local_400[local_58c] * 4);
            }
            local_4f0 = local_4f0 + (long)local_3c8 * 4;
            local_310 = local_370;
            local_2f0 = local_380;
            local_60 = local_f0;
            local_54 = local_e4;
            local_50 = local_e0;
            local_40 = local_c8;
            local_3c = local_c4;
            local_568 = local_f0;
            local_520 = local_f0;
          }
          local_2d0 = local_390;
          local_30 = local_b8;
          local_24 = local_ac;
          local_20 = local_a8;
          local_10 = local_90;
          local_c = local_8c;
          local_4c8 = local_b8;
        }
      }
    }
    local_180 = &local_468;
    iVar1 = local_480 * local_484 * local_488;
    local_218 = local_220;
    local_a0 = puVar3;
    local_468 = puVar3;
    local_458 = local_a8;
    local_450 = local_ac;
    local_448 = local_b8;
    local_43c = local_8c;
    local_438 = local_90;
    local_430 = local_94;
    for (local_5a0 = 0; local_5a0 < iVar1; local_5a0 = local_5a0 + 1) {
      local_674 = (float)puVar3[local_5a0];
      local_150 = in_stack_00000048;
      in_stack_fffffffffffff990 = (allocator_type *)(ulong)(in_stack_00000040 - 1);
      local_144[0] = local_674;
      switch(in_stack_fffffffffffff990) {
      case (allocator_type *)0x0:
        if (local_674 <= 0.0) {
          local_144[0] = 0.0;
        }
        break;
      case (allocator_type *)0x1:
        local_f8 = in_stack_00000048;
        local_100 = 0;
        local_154 = *(float *)*in_stack_00000048;
        if (local_674 <= 0.0) {
          local_674 = local_674 * local_154;
        }
        local_144[0] = local_674;
        break;
      case (allocator_type *)0x2:
        local_108 = in_stack_00000048;
        local_110 = 0;
        local_158 = *(float *)*in_stack_00000048;
        local_118 = in_stack_00000048;
        local_120 = 1;
        local_15c = *(float *)(*in_stack_00000048 + 4);
        if (local_674 < local_158) {
          local_144[0] = local_158;
        }
        if (local_15c < local_144[0]) {
          local_144[0] = local_15c;
        }
        break;
      case (allocator_type *)0x3:
        local_160 = 88.37626;
        pfVar2 = std::min<float>(local_144,&local_160);
        local_144[0] = *pfVar2;
        local_164 = -88.37626;
        pfVar2 = std::max<float>(local_144,&local_164);
        local_144[0] = *pfVar2;
        fVar5 = expf(-local_144[0]);
        local_144[0] = 1.0 / (fVar5 + 1.0);
        break;
      case (allocator_type *)0x4:
        fVar5 = expf(local_674);
        fVar5 = logf(fVar5 + 1.0);
        local_144[0] = tanhf(fVar5);
        local_144[0] = local_674 * local_144[0];
        break;
      case (allocator_type *)0x5:
        local_128 = in_stack_00000048;
        local_130 = 0;
        local_168 = *(float *)*in_stack_00000048;
        local_138 = in_stack_00000048;
        local_144[1] = 1.4013e-45;
        local_144[2] = 0.0;
        local_16c = *(float *)(*in_stack_00000048 + 4);
        local_170 = -local_16c / local_168;
        local_174 = 1.0 / local_168 + local_170;
        if (local_170 <= local_674) {
          if (local_674 <= local_174) {
            local_144[0] = local_674 * (local_674 * local_168 + local_16c);
          }
        }
        else {
          local_144[0] = 0.0;
        }
      }
      puVar3[local_5a0] = local_144[0];
    }
    local_360 = &local_468;
    local_330 = local_360;
    if (local_460 != (int *)0x0) {
      local_334 = 0xffffffff;
      LOCK();
      local_338 = *local_460;
      *local_460 = *local_460 + -1;
      UNLOCK();
      if (local_338 == 1) {
        if (local_448 == (long *)0x0) {
          local_298 = local_468;
          if (local_468 != (undefined4 *)0x0) {
            free(local_468);
          }
        }
        else {
          (**(code **)(*local_448 + 0x18))(local_448,local_468);
        }
      }
    }
    local_468 = (undefined4 *)0x0;
    local_458 = 0;
    local_450 = 0;
    local_440 = 0;
    local_43c = 0;
    local_438 = 0;
    local_434 = 0;
    local_430 = 0;
    local_428 = 0;
    local_460 = (int *)0x0;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff990);
  return 0;
}

Assistant:

static int deconvolution3d(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data, const Mat& bias_data, int kernel_w, int kernel_h, int kernel_d, int stride_w, int stride_h, int stride_d, int dilation_w, int dilation_h, int dilation_d, int activation_type, const Mat& activation_params, const Option& opt)
{
    const int outw = top_blob.w;
    const int outh = top_blob.h;
    const int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h * kernel_d;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap0 = outw * dilation_h - kernel_w * dilation_w;
        int gap1 = outh * outw * dilation_d - outw * kernel_h * dilation_h;
        for (int z = 0; z < kernel_d; z++)
        {
            for (int i = 0; i < kernel_h; i++)
            {
                for (int j = 0; j < kernel_w; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2 += dilation_w;
                }
                p2 += gap0;
            }
            p2 += gap1;
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);

        const float bias = bias_data.empty() ? 0.f : bias_data[p];

        out.fill(bias);

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int d = bottom_blob.d;
        const int inch = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;
        const int outd = top_blob.d;

        for (int z = 0; z < d; z++)
        {
            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    float* outptr = out.depth(z * stride_d).row(i * stride_h) + j * stride_w;

                    const float* kptr = (const float*)weight_data + maxk * inch * p;

                    for (int q = 0; q < inch; q++)
                    {
                        const float val = bottom_blob.channel(q).depth(z).row(i)[j];

                        for (int k = 0; k < maxk; k++)
                        {
                            float w = kptr[k];
                            outptr[space_ofs[k]] += val * w;
                        }

                        kptr += maxk;
                    }
                }
            }
        }

        {
            float* outptr = out;
            int size = outw * outh * outd;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = activation_ss(outptr[i], activation_type, activation_params);
            }
        }
    }

    return 0;
}